

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperRefs.c
# Opt level: O0

float Map_NodeReadRefPhaseEst(Map_Node_t *pNode,int fPhase)

{
  int fPhase_local;
  Map_Node_t *pNode_local;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Map_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperRefs.c"
                  ,0x41,"float Map_NodeReadRefPhaseEst(Map_Node_t *, int)");
  }
  if ((pNode->pCutBest[0] == (Map_Cut_t *)0x0) || (pNode->pCutBest[1] == (Map_Cut_t *)0x0)) {
    if ((pNode->pCutBest[0] == (Map_Cut_t *)0x0) && (pNode->pCutBest[1] == (Map_Cut_t *)0x0)) {
      __assert_fail("pNode->pCutBest[0] || pNode->pCutBest[1]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperRefs.c"
                    ,0x44,"float Map_NodeReadRefPhaseEst(Map_Node_t *, int)");
    }
    pNode_local._4_4_ = pNode->nRefEst[2];
  }
  else {
    pNode_local._4_4_ = pNode->nRefEst[fPhase];
  }
  return pNode_local._4_4_;
}

Assistant:

float Map_NodeReadRefPhaseEst( Map_Node_t * pNode, int fPhase )
{
    assert( !Map_IsComplement(pNode) );
    if ( pNode->pCutBest[0] && pNode->pCutBest[1] ) // both assigned
        return pNode->nRefEst[fPhase];
    assert( pNode->pCutBest[0] || pNode->pCutBest[1] ); // at least one assigned
//    return pNode->nRefEst[0] + pNode->nRefEst[1];
    return pNode->nRefEst[2];
}